

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  int iVar1;
  long lVar2;
  SQRESULT SVar3;
  long lVar4;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  SQChar *prec;
  SQChar f;
  SQInteger fpos;
  size_t flen;
  SQFloat tf;
  SQInteger ti;
  SQChar *ts;
  SQInteger valtype;
  SQInteger addlen;
  SQInteger w;
  SQInteger nparam;
  SQInteger i;
  SQInteger n;
  SQInteger allocated;
  SQInteger format_size;
  SQRESULT res;
  SQChar fmt [20];
  SQChar *dest;
  SQChar *format;
  SQInteger *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff37;
  SQChar *in_stack_ffffffffffffff38;
  SQChar *pSVar5;
  SQChar *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  undefined8 local_b0;
  undefined8 local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  size_t local_70;
  long local_68;
  undefined8 local_60;
  char local_58;
  SQChar aSStack_57 [31];
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long local_18;
  undefined8 local_10;
  long local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_60 = sq_getstring(in_RDI,in_RSI,&local_30);
  local_8 = local_60;
  if (-1 < local_60) {
    local_68 = sq_getsize(local_10,local_18);
    local_70 = local_68 + 2;
    local_38 = sq_getscratchpad(local_10,local_70);
    local_78 = 0;
    local_80 = 0;
    local_88 = local_18 + 1;
    local_90 = 0;
    while (lVar4 = local_88, local_78 < local_68) {
      if (*(char *)(local_30 + local_78) == '%') {
        if (*(char *)(local_30 + 1 + local_78) == '%') {
          *(undefined1 *)(local_38 + local_80) = 0x25;
          local_78 = local_78 + 2;
          local_80 = local_80 + 1;
        }
        else {
          local_78 = local_78 + 1;
          lVar2 = sq_gettop(local_10);
          if (lVar2 < lVar4) {
            SVar3 = sq_throwerror(local_10,"not enough parameters for the given format string");
            return SVar3;
          }
          local_78 = validate_format((HSQUIRRELVM)
                                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff28);
          if (local_78 < 0) {
            return -1;
          }
          local_98 = 0;
          local_a0 = 0;
          local_a8 = 0;
          local_b0 = 0;
          in_stack_ffffffffffffff4c = 0.0;
          switch(*(undefined1 *)(local_30 + local_78)) {
          case 0x45:
          case 0x47:
          case 0x65:
          case 0x66:
          case 0x67:
            lVar4 = sq_getfloat(local_10,local_88,&stack0xffffffffffffff4c);
            if (lVar4 < 0) {
              SVar3 = sq_throwerror(local_10,"float expected for the specified format");
              return SVar3;
            }
            local_98 = local_90 + 0x65;
            local_a0 = 0x66;
            break;
          default:
            SVar3 = sq_throwerror(local_10,"invalid format");
            return SVar3;
          case 0x58:
          case 100:
          case 0x69:
          case 0x6f:
          case 0x75:
          case 0x78:
            in_stack_ffffffffffffff40 = (SQChar *)strlen(&local_58);
            in_stack_ffffffffffffff37 = (&local_58)[(long)(in_stack_ffffffffffffff40 + -1)];
            pSVar5 = in_stack_ffffffffffffff40 + -1;
            for (in_stack_ffffffffffffff28 = (SQInteger *)0x110a06;
                (char)*in_stack_ffffffffffffff28 != '\0';
                in_stack_ffffffffffffff28 = (SQInteger *)((long)in_stack_ffffffffffffff28 + 1)) {
              (&local_58)[(long)pSVar5] = (char)*in_stack_ffffffffffffff28;
              pSVar5 = pSVar5 + 1;
            }
            (&local_58)[(long)pSVar5] = in_stack_ffffffffffffff37;
            in_stack_ffffffffffffff38 = pSVar5 + 2;
            (pSVar5 + -0x57)[(long)&stack0x00000000] = '\0';
          case 99:
            lVar4 = sq_getinteger(local_10,local_88,&local_b0);
            if (lVar4 < 0) {
              SVar3 = sq_throwerror(local_10,"integer expected for the specified format");
              return SVar3;
            }
            local_98 = local_90 + 0x65;
            local_a0 = 0x69;
            break;
          case 0x73:
            lVar4 = sq_getstring(local_10,local_88,&local_a8);
            if (lVar4 < 0) {
              SVar3 = sq_throwerror(local_10,"string expected for the specified format");
              return SVar3;
            }
            local_98 = sq_getsize(local_10,local_88);
            local_98 = local_98 + local_90 + 1;
            local_a0 = 0x73;
          }
          local_78 = local_78 + 1;
          local_70 = local_98 + 1 + local_70;
          local_38 = sq_getscratchpad(local_10,local_70);
          if (local_a0 == 0x66) {
            iVar1 = snprintf((char *)(local_38 + local_80),local_70,&local_58,
                             (double)in_stack_ffffffffffffff4c);
            local_80 = iVar1 + local_80;
          }
          else if (local_a0 == 0x69) {
            iVar1 = snprintf((char *)(local_38 + local_80),local_70,&local_58,local_b0);
            local_80 = iVar1 + local_80;
          }
          else if (local_a0 == 0x73) {
            iVar1 = snprintf((char *)(local_38 + local_80),local_70,&local_58,local_a8);
            local_80 = iVar1 + local_80;
          }
          local_88 = local_88 + 1;
        }
      }
      else {
        *(undefined1 *)(local_38 + local_80) = *(undefined1 *)(local_30 + local_78);
        local_78 = local_78 + 1;
        local_80 = local_80 + 1;
      }
    }
    *local_20 = local_80;
    *(undefined1 *)(local_38 + local_80) = 0;
    *local_28 = local_38;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}